

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kwsParser.cxx
# Opt level: O0

size_t __thiscall kws::Parser::FindArea(Parser *this,char *name,size_t startPos)

{
  byte bVar1;
  char *pcVar2;
  char *in_RSI;
  long in_RDI;
  size_t pos;
  undefined7 in_stack_ffffffffffffff68;
  byte in_stack_ffffffffffffff6f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  byte local_69;
  string local_48 [8];
  size_t in_stack_ffffffffffffffc0;
  undefined8 in_stack_ffffffffffffffc8;
  size_t local_28;
  
  local_28 = std::__cxx11::string::find((char *)(in_RDI + 0x518),(ulong)in_RSI);
  while( true ) {
    if (local_28 == 0xffffffffffffffff) {
      return 0xffffffffffffffff;
    }
    strlen(in_RSI);
    pcVar2 = (char *)std::__cxx11::string::operator[](in_RDI + 0x518);
    local_69 = 1;
    bVar1 = local_69;
    if (*pcVar2 != ':') {
      __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48;
      FindNextWord_abi_cxx11_((Parser *)in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
      bVar1 = std::operator==(__lhs,(char *)CONCAT17(in_stack_ffffffffffffff6f,
                                                     in_stack_ffffffffffffff68));
      std::__cxx11::string::~string(local_48);
    }
    in_stack_ffffffffffffff6f = bVar1;
    if ((in_stack_ffffffffffffff6f & 1) != 0) break;
    local_28 = std::__cxx11::string::find((char *)(in_RDI + 0x518),(ulong)in_RSI);
  }
  return local_28;
}

Assistant:

size_t Parser::FindArea(const char* name,size_t startPos) const
{
  size_t pos = m_BufferNoComment.find(name, startPos);
  while(pos != std::string::npos)
    {
    if(m_BufferNoComment[pos+strlen(name)]==':' || this->FindNextWord(pos) == ":")
      {
      return pos;
      }
    pos = m_BufferNoComment.find(name, pos+1);
    }
  return std::string::npos;
}